

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O2

void __thiscall
TPZCompElDisc::SolutionXInternal<double>(TPZCompElDisc *this,TPZVec<double> *x,TPZVec<double> *uh)

{
  double dVar1;
  uint uVar2;
  TNode *pTVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  TPZCompMesh *pTVar8;
  long *plVar9;
  TPZFMatrix<double> *this_00;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double local_158;
  TPZFMatrix<double> dphix;
  TPZFMatrix<double> phix;
  
  pTVar8 = TPZCompEl::Mesh((TPZCompEl *)this);
  plVar9 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb8
                               ))(this);
  iVar5 = (**(code **)(*plVar9 + 0x78))(plVar9);
  this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar8->fSolution);
  iVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 600))(this);
  iVar7 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb0))(this);
  dphix.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZFMatrix<double>::TPZFMatrix(&phix,(long)iVar6,1,(double *)&dphix);
  local_158 = 0.0;
  TPZFMatrix<double>::TPZFMatrix(&dphix,(long)iVar7,(long)iVar6,&local_158);
  (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x330))
            (this,x,&phix,&dphix);
  lVar10 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                     (this,0);
  pTVar3 = (pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
  uVar2 = pTVar3[*(int *)(lVar10 + 8)].dim;
  iVar6 = pTVar3[*(int *)(lVar10 + 8)].pos;
  local_158 = 0.0;
  uVar14 = 0;
  TPZVec<double>::Fill(uh,&local_158,0,-1);
  uVar12 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar12 = uVar14;
  }
  for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
    uVar4 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
    uVar13 = (long)uVar4 % (long)iVar5 & 0xffffffff;
    pdVar11 = TPZFMatrix<double>::operator()(&phix,(long)(int)((long)uVar4 / (long)iVar5),0);
    dVar1 = *pdVar11;
    pdVar11 = TPZFMatrix<double>::operator()(this_00,uVar14 + (long)iVar6,0);
    uh->fStore[uVar13] = dVar1 * *pdVar11 + uh->fStore[uVar13];
  }
  TPZFMatrix<double>::~TPZFMatrix(&dphix);
  TPZFMatrix<double>::~TPZFMatrix(&phix);
  return;
}

Assistant:

void TPZCompElDisc::SolutionXInternal(TPZVec<REAL> &x, TPZVec<TVar> &uh){
	TPZCompMesh *finemesh = Mesh();
	TPZBlock &fineblock = finemesh->Block();
	int nstate = Material()->NStateVariables();
	TPZFMatrix<TVar> &FineMeshSol = finemesh->Solution();
	int matsize = NShapeF(),dim = Dimension();
	TPZFMatrix<REAL> phix(matsize,1,0.);
	TPZFMatrix<REAL> dphix(dim,matsize,0.);
	ShapeX(x,phix,dphix);
	TPZConnect *df = &Connect(0);
	int64_t dfseq = df->SequenceNumber();
	int dfvar = fineblock.Size(dfseq);
	int64_t pos   = fineblock.Position(dfseq);
	int iv = 0,d;
	uh.Fill(0.);
	for(d=0; d<dfvar; d++) {
		uh[iv%nstate] += (TVar)phix(iv/nstate,0)*FineMeshSol(pos+d,0);
		iv++;
	}
}